

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_writer.cpp
# Opt level: O0

void __thiscall
duckdb::ArrayColumnWriter::Prepare
          (ArrayColumnWriter *this,ColumnWriterState *state_p,ColumnWriterState *parent,
          Vector *vector,idx_t count)

{
  bool bVar1;
  LogicalType *pLVar2;
  size_type sVar3;
  reference pvVar4;
  undefined8 uVar5;
  pointer this_00;
  type pCVar6;
  Vector *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  ColumnWriter *in_RDI;
  vector<bool,_std::allocator<bool>_> *in_R8;
  Vector *array_child;
  idx_t k_2;
  idx_t k_1;
  idx_t k;
  idx_t first_repeat_level;
  idx_t parent_index;
  idx_t i;
  idx_t vector_index;
  idx_t vcount;
  idx_t start;
  ValidityMask *validity;
  idx_t array_size;
  ListColumnWriterState *state;
  value_type_conflict *in_stack_fffffffffffffec8;
  ColumnWriterState *in_stack_fffffffffffffed0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffed8;
  unsafe_vector<uint16_t> *in_stack_fffffffffffffee0;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff10;
  undefined1 __x;
  vector<bool,_std::allocator<bool>_> *this_01;
  ulong local_b0;
  ulong local_a0;
  ulong local_90;
  reference local_78;
  long local_68;
  vector<bool,_std::allocator<bool>_> *local_60;
  long local_58;
  vector<bool,_std::allocator<bool>_> *local_50;
  vector<bool,_std::allocator<bool>_> *local_48;
  ValidityMask *local_40;
  ulong local_38;
  ListColumnWriterState *local_30;
  vector<bool,_std::allocator<bool>_> *local_28;
  Vector *local_20;
  long local_18;
  undefined8 local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = ColumnWriterState::Cast<duckdb::ListColumnWriterState>(in_stack_fffffffffffffed0);
  pLVar2 = Vector::GetType(local_20);
  local_38 = duckdb::ArrayType::GetSize(pLVar2);
  local_40 = FlatVector::Validity((Vector *)0x86a48b);
  local_48 = (vector<bool,_std::allocator<bool>_> *)0x0;
  this_01 = local_28;
  if (local_18 != 0) {
    sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(local_18 + 8));
    this_01 = (vector<bool,_std::allocator<bool>_> *)(sVar3 - local_30->parent_index);
  }
  local_58 = 0;
  local_50 = this_01;
  for (local_60 = local_48; local_60 < local_50;
      local_60 = (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(local_60->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1)) {
    local_68 = (long)&(local_60->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
               local_30->parent_index;
    __x = false;
    if (local_18 != 0) {
      bVar1 = std::vector<bool,_std::allocator<bool>_>::empty(in_stack_ffffffffffffff10);
      __x = false;
      if (!bVar1) {
        local_78 = vector<bool,_true>::operator[]
                             ((vector<bool,_true> *)in_stack_fffffffffffffed0,
                              (size_type)in_stack_fffffffffffffec8);
        __x = std::_Bit_reference::operator_cast_to_bool(&local_78);
      }
    }
    if ((bool)__x == false) {
      if ((local_18 == 0) ||
         (bVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::empty
                            (&in_stack_fffffffffffffee0->
                              super_vector<unsigned_short,_std::allocator<unsigned_short>_>), bVar1)
         ) {
        in_stack_ffffffffffffff10 =
             (vector<bool,_std::allocator<bool>_> *)ColumnWriter::MaxRepeat(in_RDI);
      }
      else {
        pvVar4 = vector<unsigned_short,_false>::operator[]
                           ((vector<unsigned_short,_false> *)in_stack_fffffffffffffed0,
                            (size_type)in_stack_fffffffffffffec8);
        in_stack_ffffffffffffff10 = (vector<bool,_std::allocator<bool>_> *)(ulong)*pvVar4;
      }
      if ((local_18 == 0) ||
         (pvVar4 = vector<unsigned_short,_false>::operator[]
                             ((vector<unsigned_short,_false> *)in_stack_fffffffffffffed0,
                              (size_type)in_stack_fffffffffffffec8), *pvVar4 == 0xffff)) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (in_stack_fffffffffffffed8,(idx_t)in_stack_fffffffffffffed0);
        if (bVar1) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&in_stack_fffffffffffffee0->
                      super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                     (value_type_conflict *)in_stack_fffffffffffffed8);
          std::vector<bool,_std::allocator<bool>_>::push_back(this_01,(bool)__x);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          for (local_a0 = 1; local_a0 < local_38; local_a0 = local_a0 + 1) {
            ColumnWriter::MaxRepeat(in_RDI);
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                      (&in_stack_fffffffffffffee0->
                        super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                       (value_type_conflict *)in_stack_fffffffffffffed8);
            std::vector<bool,_std::allocator<bool>_>::push_back(this_01,(bool)__x);
          }
        }
        else {
          ColumnWriter::MaxDefine(in_RDI);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          std::vector<bool,_std::allocator<bool>_>::push_back(this_01,(bool)__x);
          for (local_b0 = 1; local_b0 < local_38; local_b0 = local_b0 + 1) {
            in_stack_fffffffffffffed8 =
                 (TemplatedValidityMask<unsigned_long> *)
                 &(local_30->super_ColumnWriterState).repetition_levels;
            ColumnWriter::MaxRepeat(in_RDI);
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
            in_stack_fffffffffffffee0 = &(local_30->super_ColumnWriterState).definition_levels;
            ColumnWriter::MaxDefine(in_RDI);
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
            std::vector<bool,_std::allocator<bool>_>::push_back(this_01,(bool)__x);
          }
        }
      }
      else {
        vector<unsigned_short,_false>::operator[]
                  ((vector<unsigned_short,_false> *)in_stack_fffffffffffffed0,
                   (size_type)in_stack_fffffffffffffec8);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (&in_stack_fffffffffffffee0->
                    super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                   (value_type_conflict *)in_stack_fffffffffffffed8);
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        std::vector<bool,_std::allocator<bool>_>::push_back(this_01,(bool)__x);
        for (local_90 = 1; local_90 < local_38; local_90 = local_90 + 1) {
          ColumnWriter::MaxRepeat(in_RDI);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          vector<unsigned_short,_false>::operator[]
                    ((vector<unsigned_short,_false> *)in_stack_fffffffffffffed0,
                     (size_type)in_stack_fffffffffffffec8);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    (&in_stack_fffffffffffffee0->
                      super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                     (value_type_conflict *)in_stack_fffffffffffffed8);
          std::vector<bool,_std::allocator<bool>_>::push_back(this_01,(bool)__x);
        }
      }
      local_58 = local_58 + 1;
    }
    else {
      vector<unsigned_short,_false>::operator[]
                ((vector<unsigned_short,_false> *)in_stack_fffffffffffffed0,
                 (size_type)in_stack_fffffffffffffec8);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (&in_stack_fffffffffffffee0->
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                 (value_type_conflict *)in_stack_fffffffffffffed8);
      vector<unsigned_short,_false>::operator[]
                ((vector<unsigned_short,_false> *)in_stack_fffffffffffffed0,
                 (size_type)in_stack_fffffffffffffec8);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (&in_stack_fffffffffffffee0->
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                 (value_type_conflict *)in_stack_fffffffffffffed8);
      std::vector<bool,_std::allocator<bool>_>::push_back(this_01,(bool)__x);
    }
  }
  local_30->parent_index =
       (long)&(local_50->super__Bvector_base<std::allocator<bool>_>)._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
       local_30->parent_index;
  uVar5 = duckdb::ArrayVector::GetEntry(local_20);
  this_00 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::
            operator->((unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                        *)in_stack_fffffffffffffed0);
  pCVar6 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
           ::operator*((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                        *)this_00);
  (*this_00->_vptr_ColumnWriter[6])(this_00,pCVar6,local_10,uVar5,(long)local_28 * local_38);
  return;
}

Assistant:

void ArrayColumnWriter::Prepare(ColumnWriterState &state_p, ColumnWriterState *parent, Vector &vector, idx_t count) {
	auto &state = state_p.Cast<ListColumnWriterState>();

	auto array_size = ArrayType::GetSize(vector.GetType());
	auto &validity = FlatVector::Validity(vector);

	// write definition levels and repeats
	// the main difference between this and ListColumnWriter::Prepare is that we need to make sure to write out
	// repetition levels and definitions for the child elements of the array even if the array itself is NULL.
	idx_t start = 0;
	idx_t vcount = parent ? parent->definition_levels.size() - state.parent_index : count;
	idx_t vector_index = 0;
	for (idx_t i = start; i < vcount; i++) {
		idx_t parent_index = state.parent_index + i;
		if (parent && !parent->is_empty.empty() && parent->is_empty[parent_index]) {
			state.definition_levels.push_back(parent->definition_levels[parent_index]);
			state.repetition_levels.push_back(parent->repetition_levels[parent_index]);
			state.is_empty.push_back(true);
			continue;
		}
		auto first_repeat_level =
		    parent && !parent->repetition_levels.empty() ? parent->repetition_levels[parent_index] : MaxRepeat();
		if (parent && parent->definition_levels[parent_index] != PARQUET_DEFINE_VALID) {
			state.definition_levels.push_back(parent->definition_levels[parent_index]);
			state.repetition_levels.push_back(first_repeat_level);
			state.is_empty.push_back(false);
			for (idx_t k = 1; k < array_size; k++) {
				state.repetition_levels.push_back(MaxRepeat() + 1);
				state.definition_levels.push_back(parent->definition_levels[parent_index]);
				state.is_empty.push_back(false);
			}
		} else if (validity.RowIsValid(vector_index)) {
			// push the repetition levels
			state.definition_levels.push_back(PARQUET_DEFINE_VALID);
			state.is_empty.push_back(false);

			state.repetition_levels.push_back(first_repeat_level);
			for (idx_t k = 1; k < array_size; k++) {
				state.repetition_levels.push_back(MaxRepeat() + 1);
				state.definition_levels.push_back(PARQUET_DEFINE_VALID);
				state.is_empty.push_back(false);
			}
		} else {
			state.definition_levels.push_back(MaxDefine() - 1);
			state.repetition_levels.push_back(first_repeat_level);
			state.is_empty.push_back(false);
			for (idx_t k = 1; k < array_size; k++) {
				state.repetition_levels.push_back(MaxRepeat() + 1);
				state.definition_levels.push_back(MaxDefine() - 1);
				state.is_empty.push_back(false);
			}
		}
		vector_index++;
	}
	state.parent_index += vcount;

	auto &array_child = ArrayVector::GetEntry(vector);
	child_writer->Prepare(*state.child_state, &state_p, array_child, count * array_size);
}